

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

uint8_t __thiscall ymfm::ym2608::read_data(ym2608 *this)

{
  ushort uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  
  uVar1 = this->m_address;
  if (uVar1 < 0x10) {
    sVar2 = ssg_engine::read(&this->m_ssg,(uint)uVar1,in_RDX,in_RCX);
    return (uint8_t)sVar2;
  }
  return uVar1 == 0xff;
}

Assistant:

uint8_t ym2608::read_data()
{
	uint8_t result = 0;
	if (m_address < 0x10)
	{
		// 00-0F: Read from SSG
		result = m_ssg.read(m_address & 0x0f);
	}
	else if (m_address == 0xff)
	{
		// FF: ID code
		result = 1;
	}
	return result;
}